

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

size_t countTags(TestStream *input,uint64_t tagToCount)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long uVar3;
  char *extraout_RDX;
  size_t sVar4;
  Range payload;
  Range local_38;
  
  sVar1 = input->readPos;
  sVar4 = 0;
  while( true ) {
    iVar2 = (*(input->super_EntryStream)._vptr_EntryStream[2])(input);
    local_38._begin = (char *)CONCAT44(extraout_var,iVar2);
    if (local_38._begin == extraout_RDX) break;
    uVar3 = binlog::Range::read<unsigned_long>(&local_38);
    sVar4 = sVar4 + (uVar3 == tagToCount);
  }
  input->readPos = sVar1;
  return sVar4;
}

Assistant:

std::size_t countTags(TestStream& input, std::uint64_t tagToCount)
{
  std::size_t result = 0;
  const std::size_t oldReadPos = input.readPos;

  while (binlog::Range payload = input.nextEntryPayload())
  {
    const std::uint64_t tag = payload.read<std::uint64_t>();
    if (tag == tagToCount) { ++result; }
  }

  input.readPos = oldReadPos;

  return result;
}